

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O2

int __thiscall Cmd::completeLine(Cmd *this,State *state)

{
  pointer pcVar1;
  _Base_ptr p_Var2;
  ssize_t sVar3;
  ulong uVar4;
  int iVar5;
  pointer pcVar6;
  ulong uVar7;
  pair<const_char_*,_const_char_*> pVar8;
  char ch;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  completions;
  State saved;
  
  ch = '\0';
  completions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  completions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  completions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&completions,(this->commands_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  for (p_Var2 = (this->commands_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->commands_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    pcVar1 = (state->buf)._M_dataplus._M_p;
    pcVar6 = pcVar1 + (state->buf)._M_string_length;
    pVar8 = std::__mismatch<char_const*,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (pcVar1,pcVar6,*(undefined8 *)(p_Var2 + 1));
    if (pVar8.first == pcVar6) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&completions,(value_type *)(p_Var2 + 1));
    }
  }
  if (completions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      completions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    beep();
  }
  else {
    uVar4 = 0;
    while( true ) {
      if (uVar4 < (ulong)((long)completions.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)completions.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        State::State(&saved,state);
        state->pos = completions.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_string_length;
        std::__cxx11::string::_M_assign((string *)state);
        refreshLine(this,state);
        state->pos = saved.pos;
        std::__cxx11::string::_M_assign((string *)state);
        std::__cxx11::string::~string((string *)&saved);
      }
      else {
        refreshLine(this,state);
      }
      sVar3 = read_char(this,&ch);
      if (sVar3 < 1) {
        iVar5 = -1;
        goto LAB_00103e46;
      }
      if (ch != '\t') break;
      uVar7 = (long)completions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)completions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      uVar4 = (uVar4 + 1) % (uVar7 + 1);
      if (uVar4 == uVar7) {
        beep();
        uVar4 = uVar7;
      }
    }
    if (ch == '\x1b') {
      if (uVar4 < (ulong)((long)completions.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)completions.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        refreshLine(this,state);
      }
    }
    else if (uVar4 < (ulong)((long)completions.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)completions.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      std::__cxx11::string::_M_assign((string *)state);
      state->pos = (state->buf)._M_string_length;
    }
  }
  iVar5 = (int)ch;
LAB_00103e46:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&completions);
  return iVar5;
}

Assistant:

int completeLine(State *state) {

		char ch = 0;

		// get a list of commands
		std::vector<std::string> completions;
		completions.reserve(commands_.size());
		for (auto &&elem : commands_) {
			const std::string &name = elem.first;

			if (starts_with(name, state->buf)) {
				completions.push_back(name);
			}
		}

		if (completions.empty()) {
			beep();
		} else {
			bool stop = false;
			size_t i  = 0;

			while (!stop) {
				// Show completion or original buffer
				if (i < completions.size()) {
					State saved = *state;

					state->pos = completions[i].size();
					state->buf = completions[i];

					refreshLine(state);
					state->pos = saved.pos;
					state->buf = saved.buf;
				} else {
					refreshLine(state);
				}

				if (read_char(&ch) <= 0) {
					return -1;
				}

				switch (ch) {
				case TAB: // tab
					i = (i + 1) % (completions.size() + 1);
					if (i == completions.size())
						beep();
					break;
				case ESC: // escape
					// Re-show original buffer
					if (i < completions.size())
						refreshLine(state);
					stop = true;
					break;
				default:
					// Update buffer and return
					if (i < completions.size()) {
						state->buf = completions[i];
						state->pos = state->buf.size();
					}
					stop = true;
					break;
				}
			}
		}

		return ch;
	}